

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.hh
# Opt level: O0

void __thiscall
kratos::InterfaceRef::InterfaceRef
          (InterfaceRef *this,shared_ptr<kratos::IDefinition> *instance,Generator *gen,string *name)

{
  string *name_local;
  Generator *gen_local;
  shared_ptr<kratos::IDefinition> *instance_local;
  InterfaceRef *this_local;
  
  std::shared_ptr<kratos::IDefinition>::shared_ptr(&this->definition_,instance);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
  ::unordered_map(&this->vars_);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>_>_>
  ::unordered_map(&this->ports_);
  this->is_port_ = false;
  this->gen_ = gen;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  this->has_instantiated_ = false;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
  ::unordered_map(&this->mod_ports_);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::ModportPort>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::ModportPort>_>_>_>
  ::unordered_map(&this->modport_ports_);
  return;
}

Assistant:

explicit InterfaceRef(std::shared_ptr<IDefinition> instance, Generator *gen, std::string name)
        : definition_(std::move(instance)), gen_(gen), name_(std::move(name)) {}